

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddBddAbs.c
# Opt level: O1

DdNode * Cudd_bddXorExistAbstract(DdManager *manager,DdNode *f,DdNode *g,DdNode *cube)

{
  int iVar1;
  DdNode *pDVar2;
  
  iVar1 = bddCheckPositiveCube(manager,cube);
  if (iVar1 == 0) {
    fwrite("Error: Can only abstract positive cubes\n",0x28,1,(FILE *)manager->err);
    manager->errorCode = CUDD_INVALID_ARG;
    pDVar2 = (DdNode *)0x0;
  }
  else {
    do {
      manager->reordered = 0;
      pDVar2 = cuddBddXorExistAbstractRecur(manager,f,g,cube);
    } while (manager->reordered == 1);
  }
  return pDVar2;
}

Assistant:

DdNode *
Cudd_bddXorExistAbstract(
  DdManager * manager,
  DdNode * f,
  DdNode * g,
  DdNode * cube)
{
    DdNode *res;

    if (bddCheckPositiveCube(manager, cube) == 0) {
        (void) fprintf(manager->err,
                       "Error: Can only abstract positive cubes\n");
        manager->errorCode = CUDD_INVALID_ARG;
        return(NULL);
    }

    do {
        manager->reordered = 0;
        res = cuddBddXorExistAbstractRecur(manager, f, g, cube);
    } while (manager->reordered == 1);

    return(res);

}